

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

FilterPropagateResult
duckdb::CheckZonemapTemplated<signed_char>
          (BaseStatistics *stats,ExpressionType comparison_type,char min_value,char max_value,
          char constant)

{
  char cVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  bool bVar2;
  bool bVar3;
  string local_40;
  
  switch((int)CONCAT71(in_register_00000031,comparison_type)) {
  case 0x19:
  case 0x28:
    if (constant == max_value && constant == min_value) {
      return FILTER_ALWAYS_TRUE;
    }
    if (constant < min_value) {
      return FILTER_ALWAYS_FALSE;
    }
    return (max_value < constant) * '\x02';
  case 0x1a:
  case 0x25:
    if (max_value < constant || constant < min_value) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar2 = max_value == constant && min_value == constant;
    goto LAB_005f72a3;
  case 0x1b:
    if (max_value < constant) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar2 = SBORROW1(constant,min_value);
    cVar1 = constant - min_value;
    max_value = min_value;
    break;
  case 0x1c:
    if (constant < min_value) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar2 = SBORROW1(max_value,constant);
    cVar1 = max_value - constant;
    break;
  case 0x1d:
    if (max_value <= constant) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar3 = SBORROW1(min_value,constant);
    cVar1 = min_value - constant;
    bVar2 = min_value == constant;
    goto LAB_005f72a0;
  case 0x1e:
    if (constant <= min_value) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar3 = SBORROW1(constant,max_value);
    cVar1 = constant - max_value;
    bVar2 = constant == max_value;
LAB_005f72a0:
    bVar2 = !bVar2 && bVar3 == cVar1 < '\0';
    goto LAB_005f72a3;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Expression type in zonemap check not implemented","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar2 = max_value == constant || bVar2 != cVar1 < '\0';
LAB_005f72a3:
  return bVar2 * '\x02';
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type, T min_value,
                                            T max_value, T constant) {
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		if (ConstantExactRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		if (ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_DISTINCT_FROM:
		if (!ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (ConstantExactRange(min_value, max_value, constant)) {
			// corner case of a cluster with one numeric equal to the target constant
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// GreaterThanEquals::Operation(X, C)
		// this can be true only if max(X) >= C
		// if min(X) >= C, then this is always true
		if (GreaterThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_GREATERTHAN:
		// GreaterThan::Operation(X, C)
		// this can be true only if max(X) > C
		// if min(X) > C, then this is always true
		if (GreaterThan::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThan::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// LessThanEquals::Operation(X, C)
		// this can be true only if min(X) <= C
		// if max(X) <= C, then this is always true
		if (LessThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHAN:
		// LessThan::Operation(X, C)
		// this can be true only if min(X) < C
		// if max(X) < C, then this is always true
		if (LessThan::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThan::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	default:
		throw InternalException("Expression type in zonemap check not implemented");
	}
}